

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

treeNode * declareSequence(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *ptVar4;
  char *__end;
  string local_50;
  
  ptVar2 = declare();
  ptVar4 = ptVar2;
  while( true ) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,",","");
    bVar1 = match(&local_50,Empty);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (!bVar1) break;
    ptVar3 = declare();
    ptVar4->sibling = ptVar3;
    ptVar4 = ptVar3;
  }
  return ptVar2;
}

Assistant:

treeNode* declareSequence()
{
    auto ret = declare();
    auto p=ret;
    while(match(","))
    {
        p->sibling=declare();
        p=p->sibling;
    }
    return ret;
}